

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::WriteAlignmentChunks
          (BamStandardIndex *this,BaiAlignmentChunkVector *chunks)

{
  IBamIODevice *pIVar1;
  pointer pBVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  BamException *this_00;
  pointer chunk;
  int32_t chunkCount;
  uint local_6c;
  string local_68;
  string local_48;
  
  MergeAlignmentChunks(this,chunks);
  uVar4 = (long)(chunks->
                super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                )._M_impl.super__Vector_impl_data._M_finish -
          (long)(chunks->
                super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                )._M_impl.super__Vector_impl_data._M_start;
  local_6c = (uint)(uVar4 >> 4);
  if (this->m_isBigEndian == true) {
    local_6c = local_6c << 0x18 | (int)local_6c >> 0x18 | (local_6c & 0xff00) << 8 |
               (uint)(uVar4 >> 0xc) & 0xff00;
  }
  pIVar1 = (this->m_resources).Device;
  iVar3 = (*pIVar1->_vptr_IBamIODevice[8])(pIVar1,&local_6c,4);
  if (CONCAT44(extraout_var,iVar3) == 4) {
    pBVar2 = (chunks->
             super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
             )._M_impl.super__Vector_impl_data._M_finish;
    for (chunk = (chunks->
                 super__Vector_base<BamTools::Internal::BaiAlignmentChunk,_std::allocator<BamTools::Internal::BaiAlignmentChunk>_>
                 )._M_impl.super__Vector_impl_data._M_start; chunk != pBVar2; chunk = chunk + 1) {
      WriteAlignmentChunk(this,chunk);
    }
    return;
  }
  this_00 = (BamException *)__cxa_allocate_exception(0x28);
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"BamStandardIndex::WriteAlignmentChunks","");
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_68,"could not write BAI chunk count","");
  BamException::BamException(this_00,&local_48,&local_68);
  __cxa_throw(this_00,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::WriteAlignmentChunks(BaiAlignmentChunkVector& chunks)
{

    // make sure chunks are merged (simplified) before writing & saving summary
    MergeAlignmentChunks(chunks);

    // write chunks
    int32_t chunkCount = chunks.size();
    if (m_isBigEndian) SwapEndian_32(chunkCount);
    const int64_t numBytesWritten =
        m_resources.Device->Write((const char*)&chunkCount, sizeof(chunkCount));
    if (numBytesWritten != sizeof(chunkCount))
        throw BamException("BamStandardIndex::WriteAlignmentChunks",
                           "could not write BAI chunk count");

    // iterate over chunks
    BaiAlignmentChunkVector::const_iterator chunkIter = chunks.begin();
    BaiAlignmentChunkVector::const_iterator chunkEnd = chunks.end();
    for (; chunkIter != chunkEnd; ++chunkIter)
        WriteAlignmentChunk((*chunkIter));
}